

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionIDTestCase.cpp
# Opt level: O0

void __thiscall
SuiteSessionIDTests::TestfromString_SessionStringMissingRightArrow_StringNotPopulated::
TestfromString_SessionStringMissingRightArrow_StringNotPopulated
          (TestfromString_SessionStringMissingRightArrow_StringNotPopulated *this)

{
  char *suiteName;
  TestfromString_SessionStringMissingRightArrow_StringNotPopulated *this_local;
  
  suiteName = SuiteSessionIDTests::UnitTestSuite::GetSuiteName();
  UnitTest::Test::Test
            (&this->super_Test,"fromString_SessionStringMissingRightArrow_StringNotPopulated",
             suiteName,
             "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/test/SessionIDTestCase.cpp"
             ,0x9d);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__TestfromString_SessionStringMissingRightArrow_StringNotPopulated_00459af0
  ;
  return;
}

Assistant:

TEST(fromString_SessionStringMissingRightArrow_StringNotPopulated)
{
  std::string sessionString = "FIX.4.2:SENDER<-TARGET";

  SessionID object;
  object.fromString(sessionString);

  CHECK_EQUAL("", object.getBeginString());
  CHECK_EQUAL("", object.getSenderCompID());
  CHECK_EQUAL("", object.getTargetCompID());
}